

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall TorController::Reconnect(TorController *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = connected_cb;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(TorController **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_manager;
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = operator_new(0x18);
  *(code **)local_70._M_unused._0_8_ = disconnected_cb;
  *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
  *(TorController **)((long)local_70._M_unused._0_8_ + 0x10) = this;
  local_58 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_manager;
  bVar1 = TorControlConnection::Connect
                    (&this->conn,&this->m_tor_control_center,(ConnectionCB *)&local_50,
                     (ConnectionCB *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (!bVar1) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "Reconnect";
    logging_function._M_len = 9;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x28a,ALL,Info,(ConstevalFormatString<1U>)0xfaf17b,
               &this->m_tor_control_center);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::Reconnect()
{
    /* Try to reconnect and reestablish if we get booted - for example, Tor
     * may be restarting.
     */
    if (!conn.Connect(m_tor_control_center, std::bind(&TorController::connected_cb, this, std::placeholders::_1),
         std::bind(&TorController::disconnected_cb, this, std::placeholders::_1) )) {
        LogPrintf("tor: Re-initiating connection to Tor control port %s failed\n", m_tor_control_center);
    }
}